

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O0

_Bool ssh2_userauth_signflags(ssh2_userauth_state *s,uint *signflags,char **algname)

{
  uint uVar1;
  ssh_keyalg *self;
  char *pcVar2;
  uint supported_flags;
  ssh_keyalg *alg;
  char **algname_local;
  uint *signflags_local;
  ssh2_userauth_state *s_local;
  
  *signflags = 0;
  self = find_pubkey_alg(*algname);
  if (self == (ssh_keyalg *)0x0) {
    s_local._7_1_ = false;
  }
  else {
    uVar1 = ssh_keyalg_supported_flags(self);
    if (((((s->ppl).bpp)->ext_info_rsa_sha512_ok & 1U) == 0) || ((uVar1 & 4) == 0)) {
      if (((((s->ppl).bpp)->ext_info_rsa_sha256_ok & 1U) == 0) || ((uVar1 & 2) == 0)) {
        return false;
      }
      *signflags = 2;
    }
    else {
      *signflags = 4;
    }
    pcVar2 = ssh_keyalg_alternate_ssh_id(self,*signflags);
    *algname = pcVar2;
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool ssh2_userauth_signflags(struct ssh2_userauth_state *s,
                                    unsigned *signflags, const char **algname)
{
    *signflags = 0;                    /* default */

    const ssh_keyalg *alg = find_pubkey_alg(*algname);
    if (!alg)
        return false;          /* we don't know how to upgrade this */

    unsigned supported_flags = ssh_keyalg_supported_flags(alg);

    if (s->ppl.bpp->ext_info_rsa_sha512_ok &&
        (supported_flags & SSH_AGENT_RSA_SHA2_512)) {
        *signflags = SSH_AGENT_RSA_SHA2_512;
    } else if (s->ppl.bpp->ext_info_rsa_sha256_ok &&
               (supported_flags & SSH_AGENT_RSA_SHA2_256)) {
        *signflags = SSH_AGENT_RSA_SHA2_256;
    } else {
        return false;
    }

    *algname = ssh_keyalg_alternate_ssh_id(alg, *signflags);
    return true;
}